

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2LoadT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar2;
  uint Op;
  
  uVar2 = Insn >> 0x10 & 0xf;
  if (uVar2 != 0xf) {
    MCOperand_CreateReg0
              (Inst,(uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Insn >> 0xb & 0x1e)));
    DVar1 = DecodeT2AddrModeImm8(Inst,uVar2 << 9 | Insn & 0xff,Address_00,Decoder);
    if (DVar1 != MCDisassembler_Fail) {
      if (DVar1 == MCDisassembler_Success) {
        DVar1 = (uint)((~Insn & 0xd000) != 0) * 2 + MCDisassembler_SoftFail;
      }
      else if (DVar1 != MCDisassembler_SoftFail) {
        DVar1 = MCDisassembler_Fail;
      }
    }
    return DVar1;
  }
  uVar2 = MCInst_getOpcode(Inst);
  Decoder_00 = (void *)(ulong)uVar2;
  if ((int)uVar2 < 0x959) {
    if (uVar2 == 0x942) {
      Op = 0x947;
    }
    else {
      if (uVar2 != 0x951) {
        return MCDisassembler_Fail;
      }
      Op = 0x956;
    }
  }
  else if (uVar2 == 0x959) {
    Op = 0x95e;
  }
  else if (uVar2 == 0x961) {
    Op = 0x966;
  }
  else {
    Op = 0x96e;
    if (uVar2 != 0x969) {
      return MCDisassembler_Fail;
    }
  }
  MCInst_setOpcode(Inst,Op);
  DVar1 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder_00);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeT2LoadT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRT:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBT:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHT:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSBT:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSHT:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}